

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O0

uint * Abc_NtkMfsInterplateTruth(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  int iVar1;
  int *piVar2;
  int *pGloVars;
  int i;
  int c;
  int status;
  int nFanins;
  uint *puTruth;
  Sto_Man_t *pCnf;
  sat_solver *pSat;
  int fInvert_local;
  int nCands_local;
  int *pCands_local;
  Mfs_Man_t *p_local;
  
  puTruth = (uint *)0x0;
  pSat._0_4_ = fInvert;
  pSat._4_4_ = nCands;
  _fInvert_local = pCands;
  pCands_local = (int *)p;
  pCnf = (Sto_Man_t *)Abc_MfsCreateSolverResub(p,pCands,nCands,fInvert);
  iVar1 = sat_solver_solve((sat_solver *)pCnf,(lit *)0x0,(lit *)0x0,
                           (long)*(int *)(*(long *)pCands_local + 0x14),0,0,0);
  if (iVar1 == -1) {
    puTruth = (uint *)sat_solver_store_release((sat_solver *)pCnf);
    sat_solver_delete((sat_solver *)pCnf);
    piVar2 = Int_ManSetGlobalVars(*(Int_Man_t **)(pCands_local + 0x2c),pSat._4_4_);
    for (pGloVars._4_4_ = 0; pGloVars._4_4_ < pSat._4_4_; pGloVars._4_4_ = pGloVars._4_4_ + 1) {
      iVar1 = lit_var(_fInvert_local[pGloVars._4_4_]);
      iVar1 = Vec_IntEntry(*(Vec_Int_t **)(pCands_local + 0x14),
                           iVar1 + *(int *)(*(long *)(pCands_local + 0x28) + 8) * -2);
      piVar2[pGloVars._4_4_] = iVar1;
    }
    iVar1 = Int_ManInterpolate(*(Int_Man_t **)(pCands_local + 0x2c),(Sto_Man_t *)puTruth,0,
                               (uint **)&status);
    Sto_ManFree((Sto_Man_t *)puTruth);
    if (iVar1 != pSat._4_4_) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsInter.c"
                    ,0x10e,"unsigned int *Abc_NtkMfsInterplateTruth(Mfs_Man_t *, int *, int, int)");
    }
    p_local = _status;
  }
  else {
    pCands_local[0xc5] = pCands_local[0xc5] + 1;
    p_local = (Mfs_Man_t *)0x0;
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Abc_NtkMfsInterplateTruth( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    int nFanins, status;
    int c, i, * pGloVars;

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, fInvert );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );
    return puTruth;
}